

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_> * __thiscall
pybind11::class_<anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>>::
def_property_readonly<std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>(anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>::*)()const>
          (class_<anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>> *this,char *name,
          offset_in_Model_to_subr *fget)

{
  class_<anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_> *pcVar1;
  return_value_policy local_49;
  offset_in_Model_to_subr local_48;
  void *local_38;
  offset_in_Model_to_subr local_30;
  cpp_function local_28;
  offset_in_Model_to_subr *local_20;
  offset_in_Model_to_subr *fget_local;
  char *name_local;
  class_<anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_> *this_local;
  
  local_38 = (void *)*fget;
  local_30 = fget[1];
  local_20 = fget;
  fget_local = (offset_in_Model_to_subr *)name;
  name_local = (char *)this;
  local_48 = _anurbs__Ref<anurbs::NurbsCurveGeometry<3l>>___pybind11__method_adaptor<anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>,anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>>_std__shared_ptr<anurbs::NurbsCurveGeometry<3l>>_anurbs__Ref<anurbs::NurbsCurveGeometry<3l>>______const__
                       (local_38,local_30);
  cpp_function::
  cpp_function<std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>,anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>>
            (&local_28,local_48);
  local_49 = reference_internal;
  pcVar1 = class_<anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>::
           def_property_readonly<pybind11::return_value_policy>
                     ((class_<anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_> *)this,name,&local_28,
                      &local_49);
  cpp_function::~cpp_function(&local_28);
  return pcVar1;
}

Assistant:

class_ &def_property_readonly(const char *name, const Getter &fget, const Extra& ...extra) {
        return def_property_readonly(name, cpp_function(method_adaptor<type>(fget)),
                                     return_value_policy::reference_internal, extra...);
    }